

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O0

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar6;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  long local_338;
  size_t binLen;
  size_t srcLen;
  string *bin;
  string *src;
  undefined1 local_2f8 [8];
  ostringstream e;
  undefined1 local_180 [8];
  string binPath;
  allocator<char> local_139;
  undefined1 local_138 [8];
  string error;
  string srcPath;
  string local_f0;
  reference local_d0;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_98;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  undefined1 local_88 [7];
  bool excludeFromAll;
  string binArg;
  string *srcArg;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddSubDirectoryCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_00221dea;
  }
  binArg.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
  std::__cxx11::string::string((string *)local_88);
  __range1._7_1_ = 0;
  cVar6 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
  __begin1 = cVar6.Begin._M_current;
  local_a8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&__begin1,1);
  local_98 = &local_a8;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_98);
  arg = (string *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar1) break;
    local_d0 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar1 = std::operator==(local_d0,"EXCLUDE_FROM_ALL");
    if (bVar1) {
      __range1._7_1_ = 1;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"called with incorrect number of arguments",
                   (allocator<char> *)(srcPath.field_2._M_local_buf + 0xf));
        cmCommand::SetError(&this->super_cmCommand,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)(srcPath.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 0;
        srcPath.field_2._8_4_ = 1;
        goto LAB_00221dd4;
      }
      std::__cxx11::string::operator=((string *)local_88,(string *)local_d0);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)binArg.field_2._8_8_);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)(error.field_2._M_local_buf + 8),(string *)binArg.field_2._8_8_);
  }
  else {
    psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)psVar2);
    std::__cxx11::string::operator+=((string *)(error.field_2._M_local_buf + 8),"/");
    std::__cxx11::string::operator+=
              ((string *)(error.field_2._M_local_buf + 8),(string *)binArg.field_2._8_8_);
  }
  bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&error.field_2 + 8));
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath
              ((string *)((long)&binPath.field_2 + 8),(string *)((long)&error.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(error.field_2._M_local_buf + 8),
               (string *)(binPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(binPath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_180);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_88);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_180,(string *)local_88);
      }
      else {
        psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        std::__cxx11::string::operator=((string *)local_180,(string *)psVar2);
        std::__cxx11::string::operator+=((string *)local_180,"/");
        std::__cxx11::string::operator+=((string *)local_180,(string *)local_88);
      }
LAB_00221d1c:
      cmsys::SystemTools::CollapseFullPath(&local_3b8,(string *)local_180);
      std::__cxx11::string::operator=((string *)local_180,(string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      cmMakefile::AddSubDirectory
                ((this->super_cmCommand).Makefile,(string *)((long)&error.field_2 + 8),
                 (string *)local_180,(bool)(__range1._7_1_ & 1),true);
      this_local._7_1_ = 1;
      srcPath.field_2._8_4_ = 1;
    }
    else {
      psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      bVar1 = cmsys::SystemTools::IsSubDirectory((string *)((long)&error.field_2 + 8),psVar2);
      if (bVar1) {
        bin = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        srcLen = (size_t)cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                                   ((this->super_cmCommand).Makefile);
        binLen = std::__cxx11::string::length();
        local_338 = std::__cxx11::string::length();
        if (binLen != 0) {
          pcVar5 = (char *)std::__cxx11::string::back();
          if (*pcVar5 == '/') {
            binLen = binLen - 1;
          }
        }
        if (local_338 != 0) {
          pcVar5 = (char *)std::__cxx11::string::back();
          if (*pcVar5 == '/') {
            local_338 = local_338 + -1;
          }
        }
        std::__cxx11::string::substr((ulong)&local_378,srcLen);
        std::__cxx11::string::substr((ulong)&local_398,(ulong)((long)&error.field_2 + 8));
        std::operator+(&local_358,&local_378,&local_398);
        std::__cxx11::string::operator=((string *)local_180,(string *)&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_378);
        goto LAB_00221d1c;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      poVar4 = std::operator<<((ostream *)local_2f8,
                               "not given a binary directory but the given source directory ");
      poVar4 = std::operator<<(poVar4,"\"");
      poVar4 = std::operator<<(poVar4,(string *)(error.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,"\" is not a subdirectory of \"");
      psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      poVar4 = std::operator<<(poVar4,(string *)psVar2);
      poVar4 = std::operator<<(poVar4,"\".  ");
      poVar4 = std::operator<<(poVar4,"When specifying an out-of-tree source a binary directory ");
      std::operator<<(poVar4,"must be explicitly specified.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&src);
      std::__cxx11::string::~string((string *)&src);
      this_local._7_1_ = 0;
      srcPath.field_2._8_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
    }
    std::__cxx11::string::~string((string *)local_180);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,"given source \"",&local_139);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::operator+=((string *)local_138,(string *)binArg.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_138,"\" which is not an existing directory.");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_138);
    this_local._7_1_ = 0;
    srcPath.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_138);
  }
  std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
LAB_00221dd4:
  std::__cxx11::string::~string((string *)local_88);
LAB_00221dea:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the binpath
  std::string const& srcArg = args.front();
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = arg;
    } else {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg)) {
    srcPath = srcArg;
  } else {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
  }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(
          srcPath, this->Makefile->GetCurrentSourceDirectory())) {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const std::string& src = this->Makefile->GetCurrentSourceDirectory();
    const std::string& bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = src.length();
    size_t binLen = bin.length();
    if (srcLen > 0 && src.back() == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin.back() == '/') {
      --binLen;
    }
    binPath = bin.substr(0, binLen) + srcPath.substr(srcLen);
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg)) {
      binPath = binArg;
    } else {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, true);

  return true;
}